

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O0

void Godunov::ExtrapVelToFaces
               (MultiFab *a_vel,MultiFab *a_forces,MultiFab *a_umac,MultiFab *a_vmac,
               MultiFab *a_wmac,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,
               BCRec *d_bcrec,Geometry *geom,Real l_dt,bool use_ppm,bool use_forces_in_trans)

{
  Geometry geom_00;
  bool bVar1;
  double *pdVar2;
  Box *pBVar3;
  Array4<double> *in_RCX;
  long lVar4;
  undefined8 in_RDX;
  Box *in_RSI;
  undefined8 *puVar5;
  undefined8 *puVar6;
  FabArray<amrex::FArrayBox> *in_R9;
  byte bVar7;
  MFIter *in_stack_00000008;
  Geometry *in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  Array4<double> w_ad;
  Array4<double> v_ad;
  Array4<double> u_ad;
  Array4<double> Ipz;
  Array4<double> Imz;
  Array4<double> Ipy;
  Array4<double> Imy;
  Array4<double> Ipx;
  Array4<double> Imx;
  Real *p;
  Array4<const_double> *f;
  Array4<const_double> *vel;
  Array4<double> *wmac;
  Array4<double> *vmac;
  Array4<double> *umac;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  Box result;
  Box *bxg1;
  Box *bx;
  MFIter mfi;
  FArrayBox scratch;
  int ncomp;
  Real *dx;
  Box *domain;
  undefined1 in_stack_00000cdf;
  Real in_stack_00000ce0;
  Array4<double> *in_stack_00000ce8;
  Box *in_stack_00000cf0;
  Box *in_stack_00000cf8;
  Box *in_stack_00000d00;
  int in_stack_00000d0c;
  Box *in_stack_00000d10;
  Array4<double> *in_stack_00001ed0;
  Array4<double> *in_stack_00001ed8;
  Array4<const_double> *in_stack_00001ee0;
  Array4<const_double> *in_stack_00001ee8;
  Array4<const_double> *in_stack_00001ef0;
  Array4<const_double> *in_stack_00001ef8;
  Array4<double> *in_stack_00001f00;
  Array4<double> *in_stack_00001f08;
  Array4<double> *in_stack_00001f10;
  Array4<double> *in_stack_00001f18;
  Array4<double> *in_stack_00001f20;
  Array4<double> *in_stack_00001f28;
  Array4<const_double> *in_stack_00001f30;
  Box *in_stack_00001f38;
  Real *in_stack_00001f40;
  BCRec *in_stack_00001f48;
  Real *in_stack_00001f58;
  BARef *in_stack_ffffffffffffe9b8;
  Geometry *pGVar8;
  MFIter *in_stack_ffffffffffffe9c0;
  FabArray<amrex::FArrayBox> *pFVar9;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe9c8;
  Array4<const_double> *in_stack_ffffffffffffe9d0;
  BaseFab<double> *in_stack_ffffffffffffe9d8;
  undefined8 in_stack_ffffffffffffe9e0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_ffffffffffffe9e8;
  MFIter *in_stack_ffffffffffffe9f0;
  MFIter *in_stack_ffffffffffffea20;
  Real *in_stack_ffffffffffffea28;
  int dir;
  MFIter *in_stack_ffffffffffffea30;
  FabArray<amrex::FArrayBox> *dt;
  MFIter *vcc;
  Array4<const_double> *q;
  undefined4 in_stack_ffffffffffffec38;
  undefined4 uVar10;
  Geometry *in_stack_ffffffffffffec60;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_ffffffffffffec68;
  BCRec *in_stack_ffffffffffffec70;
  Real in_stack_ffffffffffffec78;
  Array4<double> *in_stack_ffffffffffffec80;
  Array4<double> *in_stack_ffffffffffffec88;
  Array4<double> *in_stack_ffffffffffffec90;
  Array4<double> *in_stack_ffffffffffffec98;
  Array4<double> *in_stack_ffffffffffffeca0;
  DataAllocator in_stack_ffffffffffffeca8;
  Array4<const_double> local_1320;
  Array4<const_double> local_12e0;
  Array4<double> *in_stack_ffffffffffffed90;
  Array4<const_double> *in_stack_ffffffffffffed98;
  Array4<const_double> *in_stack_ffffffffffffeda0;
  undefined1 in_stack_ffffffffffffeda8 [175];
  undefined1 in_stack_ffffffffffffee57;
  Real in_stack_ffffffffffffee58;
  Array4<double> *in_stack_ffffffffffffee60;
  Array4<double> *in_stack_ffffffffffffee68;
  Array4<double> *in_stack_ffffffffffffee70;
  Box *in_stack_ffffffffffffee78;
  Box *in_stack_ffffffffffffee80;
  Box *in_stack_ffffffffffffee88;
  Array4<const_double> *in_stack_ffffffffffffef40;
  Array4<const_double> *in_stack_ffffffffffffef48;
  Array4<const_double> *in_stack_ffffffffffffef50;
  Array4<const_double> *in_stack_ffffffffffffef58;
  Array4<const_double> *in_stack_ffffffffffffef60;
  Array4<const_double> *in_stack_ffffffffffffef68;
  Array4<const_double> *in_stack_ffffffffffffef70;
  Array4<const_double> *in_stack_ffffffffffffef78;
  Box *in_stack_ffffffffffffef80;
  BCRec *in_stack_ffffffffffffef88;
  Box local_fec;
  Array4<double> local_fd0;
  Box local_f8c;
  Array4<double> local_f70;
  Box local_f2c;
  Array4<double> local_f10;
  undefined1 local_ed0 [88];
  Real local_e78;
  int local_e58;
  Array4<double> local_e50;
  Array4<double> local_e10;
  Array4<double> local_dd0;
  Array4<double> local_d90;
  double *local_d50;
  Array4<const_double> local_d48;
  Array4<const_double> *local_d08;
  undefined1 local_d00 [136];
  MFIter *local_c78;
  BARef local_c70;
  size_type *local_be8;
  undefined1 local_bdc [40];
  undefined1 local_bb4 [28];
  __uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_b98;
  undefined1 local_b8c [28];
  undefined1 *local_b70;
  Box local_b68;
  Box *local_b40;
  int local_b34 [7];
  int *local_b18;
  MFIter local_b00;
  undefined4 local_a54;
  Real *local_a50;
  MFIter *local_a48;
  byte local_a3a;
  byte local_a39;
  FabArray<amrex::FArrayBox> *local_a30;
  undefined4 local_9fc;
  int *local_9f8;
  Dim3 local_9f0;
  Dim3 local_9dc;
  Dim3 local_9d0;
  Dim3 local_9c0;
  undefined4 local_9b4;
  Box *local_9b0;
  double *local_9a8;
  Dim3 local_9a0;
  Dim3 local_98c;
  Dim3 local_980;
  Dim3 local_970;
  undefined4 local_964;
  Box *local_960;
  double *local_958;
  Dim3 local_950;
  Dim3 local_93c;
  Dim3 local_930;
  Dim3 local_920;
  undefined4 local_914;
  Box *local_910;
  double *local_908;
  Dim3 local_900;
  Dim3 local_8ec;
  Dim3 local_8e0;
  Dim3 local_8d0;
  undefined4 local_8c4;
  Box *local_8c0;
  double *local_8b8;
  Dim3 local_8b0;
  Dim3 local_8a0;
  Dim3 local_890;
  Dim3 local_880;
  undefined4 local_874;
  Box *local_870;
  double *local_868;
  Dim3 local_860;
  Dim3 local_850;
  Dim3 local_840;
  Dim3 local_830;
  undefined4 local_824;
  Box *local_820;
  double *local_818;
  Dim3 local_810;
  Dim3 local_800;
  Dim3 local_7f0;
  Dim3 local_7e0;
  undefined4 local_7d4;
  Box *local_7d0;
  double *local_7c8;
  Dim3 local_7c0;
  Dim3 local_7b0;
  Dim3 local_7a0;
  Dim3 local_790;
  undefined4 local_784;
  Box *local_780;
  double *local_778;
  Dim3 local_770;
  Dim3 local_760;
  Dim3 local_750;
  Dim3 local_740;
  undefined4 local_734;
  Box *local_730;
  double *local_728;
  Array4<double> *local_720;
  Array4<double> *local_718;
  Array4<double> *local_710;
  undefined1 *local_708;
  Array4<double> *local_700;
  Array4<double> *local_6f8;
  Array4<double> *local_6f0;
  Array4<double> *local_6e8;
  Array4<double> *local_6e0;
  undefined4 local_6d4;
  Box *local_6d0;
  undefined4 local_6c4;
  Box *local_6c0;
  undefined4 local_6b4;
  Box *local_6b0;
  undefined4 local_6a8;
  undefined4 local_6a4;
  IntVect *local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  IntVect *local_690;
  undefined4 local_688;
  undefined4 local_684;
  IntVect *local_680;
  undefined4 local_674;
  IndexType *local_670;
  undefined4 local_664;
  IndexType *local_660;
  undefined4 local_654;
  IndexType *local_650;
  undefined4 local_644;
  IndexType *local_640;
  undefined4 local_634;
  IndexType *local_630;
  undefined4 local_624;
  IndexType *local_620;
  undefined4 local_614;
  IndexType *local_610;
  undefined4 local_604;
  IndexType *local_600;
  undefined4 local_5f4;
  IndexType *local_5f0;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  undefined4 local_5d4;
  Dim3 local_5d0;
  Box *local_5c0;
  int local_5b8;
  int iStack_5b4;
  int local_5b0;
  undefined4 local_5ac;
  Box *local_5a8;
  undefined4 local_59c;
  Box *local_598;
  undefined4 local_58c;
  Box *local_588;
  Dim3 local_580;
  Box *local_570;
  int local_568;
  int iStack_564;
  int local_560;
  undefined4 local_55c;
  Box *local_558;
  undefined4 local_54c;
  Box *local_548;
  undefined4 local_53c;
  Box *local_538;
  Dim3 local_530;
  Box *local_520;
  int local_518;
  int iStack_514;
  int local_510;
  undefined4 local_50c;
  Box *local_508;
  undefined4 local_4fc;
  Box *local_4f8;
  undefined4 local_4ec;
  Box *local_4e8;
  Dim3 local_4e0;
  Box *local_4d0;
  int local_4c8;
  int iStack_4c4;
  int local_4c0;
  undefined4 local_4bc;
  Box *local_4b8;
  undefined4 local_4ac;
  Box *local_4a8;
  undefined4 local_49c;
  Box *local_498;
  Dim3 local_490;
  Box *local_480;
  int local_478;
  int iStack_474;
  int local_470;
  undefined4 local_46c;
  Box *local_468;
  undefined4 local_45c;
  Box *local_458;
  undefined4 local_44c;
  Box *local_448;
  Dim3 local_440;
  Box *local_430;
  int local_428;
  int iStack_424;
  int local_420;
  undefined4 local_41c;
  Box *local_418;
  undefined4 local_40c;
  Box *local_408;
  undefined4 local_3fc;
  Box *local_3f8;
  Dim3 local_3f0;
  Box *local_3e0;
  int local_3d8;
  int iStack_3d4;
  int local_3d0;
  undefined4 local_3cc;
  Box *local_3c8;
  undefined4 local_3bc;
  Box *local_3b8;
  undefined4 local_3ac;
  Box *local_3a8;
  Dim3 local_3a0;
  Box *local_390;
  int local_388;
  int iStack_384;
  int local_380;
  undefined4 local_37c;
  Box *local_378;
  undefined4 local_36c;
  Box *local_368;
  undefined4 local_35c;
  Box *local_358;
  Dim3 local_350;
  Box *local_340;
  int local_338;
  int iStack_334;
  int local_330;
  undefined4 local_32c;
  Box *local_328;
  undefined4 local_31c;
  Box *local_318;
  undefined4 local_30c;
  Box *local_308;
  Dim3 local_300;
  Box *local_2f0;
  int local_2e8;
  int iStack_2e4;
  int local_2e0;
  undefined4 local_2dc;
  IntVect *local_2d8;
  undefined4 local_2cc;
  IntVect *local_2c8;
  undefined4 local_2bc;
  IntVect *local_2b8;
  Dim3 local_2b0;
  Box *local_2a0;
  int local_298;
  int iStack_294;
  int local_290;
  undefined4 local_28c;
  IntVect *local_288;
  undefined4 local_27c;
  IntVect *local_278;
  undefined4 local_26c;
  IntVect *local_268;
  Dim3 local_260;
  Box *local_250;
  int local_248;
  int iStack_244;
  int local_240;
  undefined4 local_23c;
  IntVect *local_238;
  undefined4 local_22c;
  IntVect *local_228;
  undefined4 local_21c;
  IntVect *local_218;
  Dim3 local_210;
  Box *local_200;
  int local_1f8;
  int iStack_1f4;
  int local_1f0;
  undefined4 local_1ec;
  IntVect *local_1e8;
  undefined4 local_1dc;
  IntVect *local_1d8;
  undefined4 local_1cc;
  IntVect *local_1c8;
  Dim3 local_1c0;
  Box *local_1b0;
  int local_1a8;
  int iStack_1a4;
  int local_1a0;
  undefined4 local_19c;
  IntVect *local_198;
  undefined4 local_18c;
  IntVect *local_188;
  undefined4 local_17c;
  IntVect *local_178;
  Dim3 local_170;
  Box *local_160;
  int local_158;
  int iStack_154;
  int local_150;
  undefined4 local_14c;
  IntVect *local_148;
  undefined4 local_13c;
  IntVect *local_138;
  undefined4 local_12c;
  IntVect *local_128;
  Dim3 local_120;
  Box *local_110;
  int local_108;
  int iStack_104;
  int local_100;
  undefined4 local_fc;
  IntVect *local_f8;
  undefined4 local_ec;
  IntVect *local_e8;
  undefined4 local_dc;
  IntVect *local_d8;
  Dim3 local_d0;
  Box *local_c0;
  int local_b8;
  int iStack_b4;
  int local_b0;
  undefined4 local_ac;
  IntVect *local_a8;
  undefined4 local_9c;
  IntVect *local_98;
  undefined4 local_8c;
  IntVect *local_88;
  Dim3 local_80;
  Box *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  
  do_tiling_ = (undefined1)((ulong)in_stack_ffffffffffffe9e0 >> 0x38);
  bVar7 = 0;
  local_a39 = in_stack_00000018 & 1;
  local_a3a = in_stack_00000020 & 1;
  local_a30 = in_R9;
  local_a48 = (MFIter *)amrex::Geometry::Domain(in_stack_00000010);
  local_a50 = amrex::CoordSys::CellSize(&in_stack_00000010->super_CoordSys);
  local_a54 = 3;
  amrex::FArrayBox::FArrayBox((FArrayBox *)in_stack_ffffffffffffe9c0);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)do_tiling_);
  while( true ) {
    dir = (int)((ulong)in_stack_ffffffffffffea28 >> 0x20);
    bVar1 = amrex::MFIter::isValid(&local_b00);
    if (!bVar1) break;
    vcc = &local_b00;
    amrex::MFIter::tilebox(in_stack_ffffffffffffea20);
    local_9fc = 1;
    local_b18 = local_b34;
    local_9f8 = local_b34;
    amrex::Box::grow(&local_b68,1);
    uVar10 = 0;
    local_b40 = &local_b68;
    amrex::MFIter::nodaltilebox(in_stack_ffffffffffffea30,dir);
    local_b70 = local_b8c;
    amrex::MFIter::nodaltilebox(in_stack_ffffffffffffea30,dir);
    local_b98._M_t.
    super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
          )(tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
            )local_bb4;
    amrex::MFIter::nodaltilebox(in_stack_ffffffffffffea30,dir);
    local_bdc._28_8_ = (pointer)local_bdc;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
    local_be8 = &local_c70.hash._M_h._M_bucket_count;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
    local_c70.hash._M_h._M_buckets = (__buckets_ptr)&local_c70;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
    dt = (FabArray<amrex::FArrayBox> *)local_d00;
    local_c78 = (MFIter *)(local_d00 + 0x48);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
    q = &local_d48;
    local_d00._64_8_ = dt;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
    local_d08 = q;
    amrex::FArrayBox::resize
              ((FArrayBox *)in_stack_ffffffffffffe9d0,(Box *)in_stack_ffffffffffffe9c8,
               (int)((ulong)in_stack_ffffffffffffe9c0 >> 0x20),(Arena *)in_stack_ffffffffffffe9b8);
    local_d50 = amrex::BaseFab<double>::dataPtr
                          (in_stack_ffffffffffffe9d8,(int)((ulong)in_stack_ffffffffffffe9d0 >> 0x20)
                          );
    local_730 = local_b40;
    local_734 = 3;
    local_5c0 = local_b40;
    local_588 = local_b40;
    local_58c = 0;
    local_5b8 = (local_b40->smallend).vect[0];
    local_598 = local_b40;
    local_59c = 1;
    iStack_5b4 = (local_b40->smallend).vect[1];
    local_750.x = (local_b40->smallend).vect[0];
    local_750.y = (local_b40->smallend).vect[1];
    local_5a8 = local_b40;
    local_5ac = 2;
    local_750.z = (local_b40->smallend).vect[2];
    local_2f0 = local_b40;
    local_2b8 = &local_b40->bigend;
    local_2bc = 0;
    local_2e8 = local_2b8->vect[0] + 1;
    local_2c8 = &local_b40->bigend;
    local_2cc = 1;
    iStack_2e4 = (local_b40->bigend).vect[1] + 1;
    local_2d8 = &local_b40->bigend;
    local_2dc = 2;
    local_770.z = (local_b40->bigend).vect[2] + 1;
    local_770.y = iStack_2e4;
    local_770.x = local_2e8;
    local_760._0_8_ = local_770._0_8_;
    local_760.z = local_770.z;
    local_740._0_8_ = local_750._0_8_;
    local_740.z = local_750.z;
    local_728 = local_d50;
    local_5d0._0_8_ = local_750._0_8_;
    local_5d0.z = local_750.z;
    local_5b0 = local_750.z;
    local_300._0_8_ = local_770._0_8_;
    local_300.z = local_770.z;
    local_2e0 = local_770.z;
    amrex::Array4<double>::Array4(&local_d90,local_d50,&local_740,&local_760,3);
    local_d50 = local_d50 + local_d90.nstride * local_d90.ncomp;
    local_780 = local_b40;
    local_784 = 3;
    local_570 = local_b40;
    local_538 = local_b40;
    local_53c = 0;
    local_568 = (local_b40->smallend).vect[0];
    local_548 = local_b40;
    local_54c = 1;
    iStack_564 = (local_b40->smallend).vect[1];
    local_7a0.x = (local_b40->smallend).vect[0];
    local_7a0.y = (local_b40->smallend).vect[1];
    local_558 = local_b40;
    local_55c = 2;
    local_7a0.z = (local_b40->smallend).vect[2];
    local_2a0 = local_b40;
    local_268 = &local_b40->bigend;
    local_26c = 0;
    local_298 = local_268->vect[0] + 1;
    local_278 = &local_b40->bigend;
    local_27c = 1;
    iStack_294 = (local_b40->bigend).vect[1] + 1;
    local_288 = &local_b40->bigend;
    local_28c = 2;
    local_7c0.z = (local_b40->bigend).vect[2] + 1;
    local_7c0.y = iStack_294;
    local_7c0.x = local_298;
    local_7b0._0_8_ = local_7c0._0_8_;
    local_7b0.z = local_7c0.z;
    local_790._0_8_ = local_7a0._0_8_;
    local_790.z = local_7a0.z;
    local_778 = local_d50;
    local_6e0 = &local_d90;
    local_580._0_8_ = local_7a0._0_8_;
    local_580.z = local_7a0.z;
    local_560 = local_7a0.z;
    local_2b0._0_8_ = local_7c0._0_8_;
    local_2b0.z = local_7c0.z;
    local_290 = local_7c0.z;
    amrex::Array4<double>::Array4(&local_dd0,local_d50,&local_790,&local_7b0,3);
    local_d50 = local_d50 + local_dd0.nstride * local_dd0.ncomp;
    local_7d0 = local_b40;
    local_7d4 = 3;
    local_520 = local_b40;
    local_4e8 = local_b40;
    local_4ec = 0;
    local_518 = (local_b40->smallend).vect[0];
    local_4f8 = local_b40;
    local_4fc = 1;
    iStack_514 = (local_b40->smallend).vect[1];
    local_7f0.x = (local_b40->smallend).vect[0];
    local_7f0.y = (local_b40->smallend).vect[1];
    local_508 = local_b40;
    local_50c = 2;
    local_7f0.z = (local_b40->smallend).vect[2];
    local_250 = local_b40;
    local_218 = &local_b40->bigend;
    local_21c = 0;
    local_248 = local_218->vect[0] + 1;
    local_228 = &local_b40->bigend;
    local_22c = 1;
    iStack_244 = (local_b40->bigend).vect[1] + 1;
    local_238 = &local_b40->bigend;
    local_23c = 2;
    local_810.z = (local_b40->bigend).vect[2] + 1;
    local_810.y = iStack_244;
    local_810.x = local_248;
    local_800._0_8_ = local_810._0_8_;
    local_800.z = local_810.z;
    local_7e0._0_8_ = local_7f0._0_8_;
    local_7e0.z = local_7f0.z;
    local_7c8 = local_d50;
    local_6e8 = &local_dd0;
    local_530._0_8_ = local_7f0._0_8_;
    local_530.z = local_7f0.z;
    local_510 = local_7f0.z;
    local_260._0_8_ = local_810._0_8_;
    local_260.z = local_810.z;
    local_240 = local_810.z;
    amrex::Array4<double>::Array4(&local_e10,local_d50,&local_7e0,&local_800,3);
    local_d50 = local_d50 + local_e10.nstride * local_e10.ncomp;
    local_820 = local_b40;
    local_824 = 3;
    local_4d0 = local_b40;
    local_498 = local_b40;
    local_49c = 0;
    local_4c8 = (local_b40->smallend).vect[0];
    local_4a8 = local_b40;
    local_4ac = 1;
    iStack_4c4 = (local_b40->smallend).vect[1];
    local_840.x = (local_b40->smallend).vect[0];
    local_840.y = (local_b40->smallend).vect[1];
    local_4b8 = local_b40;
    local_4bc = 2;
    local_840.z = (local_b40->smallend).vect[2];
    local_200 = local_b40;
    local_1c8 = &local_b40->bigend;
    local_1cc = 0;
    local_1f8 = local_1c8->vect[0] + 1;
    local_1d8 = &local_b40->bigend;
    local_1dc = 1;
    iStack_1f4 = (local_b40->bigend).vect[1] + 1;
    local_1e8 = &local_b40->bigend;
    local_1ec = 2;
    local_860.z = (local_b40->bigend).vect[2] + 1;
    local_860.y = iStack_1f4;
    local_860.x = local_1f8;
    local_850._0_8_ = local_860._0_8_;
    local_850.z = local_860.z;
    local_830._0_8_ = local_840._0_8_;
    local_830.z = local_840.z;
    local_818 = local_d50;
    local_6f0 = &local_e10;
    local_4e0._0_8_ = local_840._0_8_;
    local_4e0.z = local_840.z;
    local_4c0 = local_840.z;
    local_210._0_8_ = local_860._0_8_;
    local_210.z = local_860.z;
    local_1f0 = local_860.z;
    amrex::Array4<double>::Array4(&local_e50,local_d50,&local_830,&local_850,3);
    local_d50 = local_d50 + local_e50.nstride * local_e50.ncomp;
    local_870 = local_b40;
    local_874 = 3;
    local_480 = local_b40;
    local_448 = local_b40;
    local_44c = 0;
    local_478 = (local_b40->smallend).vect[0];
    local_458 = local_b40;
    local_45c = 1;
    iStack_474 = (local_b40->smallend).vect[1];
    local_890.x = (local_b40->smallend).vect[0];
    local_890.y = (local_b40->smallend).vect[1];
    local_468 = local_b40;
    local_46c = 2;
    local_890.z = (local_b40->smallend).vect[2];
    local_1b0 = local_b40;
    local_178 = &local_b40->bigend;
    local_17c = 0;
    local_1a8 = local_178->vect[0] + 1;
    local_188 = &local_b40->bigend;
    local_18c = 1;
    iStack_1a4 = (local_b40->bigend).vect[1] + 1;
    local_198 = &local_b40->bigend;
    local_19c = 2;
    local_8b0.z = (local_b40->bigend).vect[2] + 1;
    local_8b0.y = iStack_1a4;
    local_8b0.x = local_1a8;
    local_8a0._0_8_ = local_8b0._0_8_;
    local_8a0.z = local_8b0.z;
    local_880._0_8_ = local_890._0_8_;
    local_880.z = local_890.z;
    local_868 = local_d50;
    local_6f8 = &local_e50;
    local_490._0_8_ = local_890._0_8_;
    local_490.z = local_890.z;
    local_470 = local_890.z;
    local_1c0._0_8_ = local_8b0._0_8_;
    local_1c0.z = local_8b0.z;
    local_1a0 = local_8b0.z;
    amrex::Array4<double>::Array4
              ((Array4<double> *)(local_ed0 + 0x40),local_d50,&local_880,&local_8a0,3);
    local_d50 = local_d50 + (long)local_e78 * (long)local_e58;
    local_8c0 = local_b40;
    local_8c4 = 3;
    local_430 = local_b40;
    local_3f8 = local_b40;
    local_3fc = 0;
    local_428 = (local_b40->smallend).vect[0];
    local_408 = local_b40;
    local_40c = 1;
    iStack_424 = (local_b40->smallend).vect[1];
    local_8e0.x = (local_b40->smallend).vect[0];
    local_8e0.y = (local_b40->smallend).vect[1];
    local_418 = local_b40;
    local_41c = 2;
    local_8e0.z = (local_b40->smallend).vect[2];
    local_160 = local_b40;
    local_128 = &local_b40->bigend;
    local_12c = 0;
    local_158 = local_128->vect[0] + 1;
    local_138 = &local_b40->bigend;
    local_13c = 1;
    iStack_154 = (local_b40->bigend).vect[1] + 1;
    local_148 = &local_b40->bigend;
    local_14c = 2;
    local_900.z = (local_b40->bigend).vect[2] + 1;
    local_900.y = iStack_154;
    local_900.x = local_158;
    local_8ec._0_8_ = local_900._0_8_;
    local_8ec.z = local_900.z;
    local_8d0._0_8_ = local_8e0._0_8_;
    local_8d0.z = local_8e0.z;
    local_8b8 = local_d50;
    local_700 = (Array4<double> *)(local_ed0 + 0x40);
    local_440._0_8_ = local_8e0._0_8_;
    local_440.z = local_8e0.z;
    local_420 = local_8e0.z;
    local_170._0_8_ = local_900._0_8_;
    local_170.z = local_900.z;
    local_150 = local_900.z;
    amrex::Array4<double>::Array4((Array4<double> *)local_ed0,local_d50,&local_8d0,&local_8ec,3);
    local_708 = local_ed0;
    pdVar2 = local_d50 + local_ed0._24_8_ * (long)(int)local_ed0._56_4_;
    local_f2c.smallend.vect._0_8_ = *(undefined8 *)local_b18;
    local_f2c.smallend.vect[2] = local_b18[2];
    local_f2c.bigend.vect[0] = local_b18[3];
    local_f2c.bigend.vect._4_8_ = *(undefined8 *)(local_b18 + 4);
    local_f2c.btype.itype = local_b18[6];
    local_d50 = pdVar2;
    pBVar3 = amrex::Box::grow(&local_f2c,1,1);
    local_910 = amrex::Box::grow(pBVar3,2,1);
    local_6b4 = 0;
    local_670 = &local_910->btype;
    local_674 = 0;
    local_5f4 = 0;
    local_5e8 = 0;
    if ((local_670->itype & 1) == 0) {
      local_6a0 = &local_910->bigend;
      local_6a4 = 0;
      local_6a8 = 1;
      local_6a0->vect[0] = local_6a0->vect[0] + 1;
      local_640 = &local_910->btype;
      local_644 = 0;
      local_5d4 = 0;
      local_640->itype = local_640->itype | 1;
    }
    local_914 = 1;
    local_3ac = 0;
    local_3d8 = (local_910->smallend).vect[0];
    local_3bc = 1;
    iStack_3d4 = (local_910->smallend).vect[1];
    local_930.x = (local_910->smallend).vect[0];
    local_930.y = (local_910->smallend).vect[1];
    local_3cc = 2;
    local_930.z = (local_910->smallend).vect[2];
    local_d8 = &local_910->bigend;
    local_dc = 0;
    local_108 = local_d8->vect[0] + 1;
    local_e8 = &local_910->bigend;
    local_ec = 1;
    iStack_104 = (local_910->bigend).vect[1] + 1;
    local_f8 = &local_910->bigend;
    local_fc = 2;
    local_950.z = (local_910->bigend).vect[2] + 1;
    local_950.y = iStack_104;
    local_950.x = local_108;
    local_93c._0_8_ = local_950._0_8_;
    local_93c.z = local_950.z;
    local_920._0_8_ = local_930._0_8_;
    local_920.z = local_930.z;
    local_908 = pdVar2;
    local_6b0 = local_910;
    local_5f0 = local_670;
    local_3f0._0_8_ = local_930._0_8_;
    local_3f0.z = local_930.z;
    local_3e0 = local_910;
    local_3d0 = local_930.z;
    local_3c8 = local_910;
    local_3b8 = local_910;
    local_3a8 = local_910;
    local_120._0_8_ = local_950._0_8_;
    local_120.z = local_950.z;
    local_110 = local_910;
    local_100 = local_950.z;
    amrex::Array4<double>::Array4(&local_f10,pdVar2,&local_920,&local_93c,1);
    local_710 = &local_f10;
    pdVar2 = local_d50 + local_f10.nstride * local_f10.ncomp;
    local_f8c.smallend.vect._0_8_ = *(undefined8 *)local_b18;
    local_f8c.smallend.vect[2] = local_b18[2];
    local_f8c.bigend.vect[0] = local_b18[3];
    local_f8c.bigend.vect._4_8_ = *(undefined8 *)(local_b18 + 4);
    local_f8c.btype.itype = local_b18[6];
    local_d50 = pdVar2;
    pBVar3 = amrex::Box::grow(&local_f8c,0,1);
    local_960 = amrex::Box::grow(pBVar3,2,1);
    local_6c4 = 1;
    local_660 = &local_960->btype;
    local_664 = 1;
    local_604 = 1;
    local_5e4 = 1;
    if ((local_660->itype & 2) == 0) {
      local_690 = &local_960->bigend;
      local_694 = 1;
      local_698 = 1;
      (local_960->bigend).vect[1] = (local_960->bigend).vect[1] + 1;
      local_630 = &local_960->btype;
      local_634 = 1;
      local_5d8 = 1;
      local_630->itype = local_630->itype | 2;
    }
    local_964 = 1;
    local_35c = 0;
    local_388 = (local_960->smallend).vect[0];
    local_36c = 1;
    iStack_384 = (local_960->smallend).vect[1];
    local_980.x = (local_960->smallend).vect[0];
    local_980.y = (local_960->smallend).vect[1];
    local_37c = 2;
    local_980.z = (local_960->smallend).vect[2];
    local_88 = &local_960->bigend;
    local_8c = 0;
    local_b8 = local_88->vect[0] + 1;
    local_98 = &local_960->bigend;
    local_9c = 1;
    iStack_b4 = (local_960->bigend).vect[1] + 1;
    local_a8 = &local_960->bigend;
    local_ac = 2;
    local_9a0.z = (local_960->bigend).vect[2] + 1;
    local_9a0.y = iStack_b4;
    local_9a0.x = local_b8;
    local_98c._0_8_ = local_9a0._0_8_;
    local_98c.z = local_9a0.z;
    local_970._0_8_ = local_980._0_8_;
    local_970.z = local_980.z;
    local_958 = pdVar2;
    local_6c0 = local_960;
    local_600 = local_660;
    local_3a0._0_8_ = local_980._0_8_;
    local_3a0.z = local_980.z;
    local_390 = local_960;
    local_380 = local_980.z;
    local_378 = local_960;
    local_368 = local_960;
    local_358 = local_960;
    local_d0._0_8_ = local_9a0._0_8_;
    local_d0.z = local_9a0.z;
    local_c0 = local_960;
    local_b0 = local_9a0.z;
    amrex::Array4<double>::Array4(&local_f70,pdVar2,&local_970,&local_98c,1);
    local_718 = &local_f70;
    pdVar2 = local_d50 + local_f70.nstride * local_f70.ncomp;
    local_fec.smallend.vect._0_8_ = *(undefined8 *)local_b18;
    local_fec.smallend.vect[2] = local_b18[2];
    local_fec.bigend.vect[0] = local_b18[3];
    local_fec.bigend.vect._4_8_ = *(undefined8 *)(local_b18 + 4);
    local_fec.btype.itype = local_b18[6];
    local_d50 = pdVar2;
    pBVar3 = amrex::Box::grow(&local_fec,0,1);
    local_9b0 = amrex::Box::grow(pBVar3,1,1);
    local_6d4 = 2;
    local_650 = &local_9b0->btype;
    local_654 = 2;
    local_614 = 2;
    local_5e0 = 2;
    if ((local_650->itype & 4) == 0) {
      local_680 = &local_9b0->bigend;
      local_684 = 2;
      local_688 = 1;
      (local_9b0->bigend).vect[2] = (local_9b0->bigend).vect[2] + 1;
      local_620 = &local_9b0->btype;
      local_624 = 2;
      local_5dc = 2;
      local_620->itype = local_620->itype | 4;
    }
    local_9b4 = 1;
    local_30c = 0;
    local_338 = (local_9b0->smallend).vect[0];
    local_31c = 1;
    iStack_334 = (local_9b0->smallend).vect[1];
    local_9d0.x = (local_9b0->smallend).vect[0];
    local_9d0.y = (local_9b0->smallend).vect[1];
    local_32c = 2;
    local_9d0.z = (local_9b0->smallend).vect[2];
    local_38 = &local_9b0->bigend;
    local_3c = 0;
    local_68 = local_38->vect[0] + 1;
    local_48 = &local_9b0->bigend;
    local_4c = 1;
    iStack_64 = (local_9b0->bigend).vect[1] + 1;
    local_58 = &local_9b0->bigend;
    local_5c = 2;
    local_9f0.z = (local_9b0->bigend).vect[2] + 1;
    local_9f0.y = iStack_64;
    local_9f0.x = local_68;
    local_9dc._0_8_ = local_9f0._0_8_;
    local_9dc.z = local_9f0.z;
    local_9c0._0_8_ = local_9d0._0_8_;
    local_9c0.z = local_9d0.z;
    local_9a8 = pdVar2;
    local_6d0 = local_9b0;
    local_610 = local_650;
    local_350._0_8_ = local_9d0._0_8_;
    local_350.z = local_9d0.z;
    local_340 = local_9b0;
    local_330 = local_9d0.z;
    local_328 = local_9b0;
    local_318 = local_9b0;
    local_308 = local_9b0;
    local_80._0_8_ = local_9f0._0_8_;
    local_80.z = local_9f0.z;
    local_70 = local_9b0;
    local_60 = local_9f0.z;
    amrex::Array4<double>::Array4(&local_fd0,pdVar2,&local_9c0,&local_9dc,1);
    pFVar9 = (FabArray<amrex::FArrayBox> *)local_d00._64_8_;
    local_720 = &local_fd0;
    local_d50 = local_d50 + local_fd0.nstride * local_fd0.ncomp;
    if ((local_a39 & 1) == 0) {
      amrex::Box::Box<double>
                ((Box *)in_stack_ffffffffffffe9c0,(Array4<double> *)in_stack_ffffffffffffe9b8);
      pGVar8 = in_stack_00000010;
      pFVar9 = local_a30;
      PLM::PredictVelOnXFace
                (in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,
                 (Array4<double> *)CONCAT44(uVar10,in_stack_ffffffffffffec38),q,
                 (Array4<const_double> *)vcc,in_stack_ffffffffffffec60,(Real)dt,
                 in_stack_ffffffffffffec68,in_stack_ffffffffffffec70);
      amrex::Box::Box<double>((Box *)pFVar9,(Array4<double> *)pGVar8);
      pGVar8 = in_stack_00000010;
      pFVar9 = local_a30;
      PLM::PredictVelOnYFace
                (in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,
                 (Array4<double> *)CONCAT44(uVar10,in_stack_ffffffffffffec38),q,
                 (Array4<const_double> *)vcc,in_stack_ffffffffffffec60,(Real)dt,
                 in_stack_ffffffffffffec68,in_stack_ffffffffffffec70);
      amrex::Box::Box<double>((Box *)pFVar9,(Array4<double> *)pGVar8);
      pGVar8 = in_stack_00000010;
      pFVar9 = local_a30;
      PLM::PredictVelOnZFace
                (in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,
                 (Array4<double> *)CONCAT44(uVar10,in_stack_ffffffffffffec38),q,
                 (Array4<const_double> *)vcc,in_stack_ffffffffffffec60,(Real)dt,
                 in_stack_ffffffffffffec68,in_stack_ffffffffffffec70);
    }
    else {
      memcpy(&stack0xffffffffffffef48,in_stack_00000010,200);
      puVar5 = (undefined8 *)&stack0xffffffffffffef48;
      puVar6 = (undefined8 *)&stack0xffffffffffffe9d0;
      for (lVar4 = 0x19; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      }
      pGVar8 = (Geometry *)local_ed0;
      geom_00.domain.smallend.vect[0]._3_1_ = in_stack_ffffffffffffee57;
      geom_00._0_175_ = in_stack_ffffffffffffeda8;
      geom_00.domain.smallend.vect._4_8_ = in_stack_ffffffffffffee58;
      geom_00.domain.bigend.vect._0_8_ = in_stack_ffffffffffffee60;
      geom_00.domain._20_8_ = in_stack_ffffffffffffee68;
      PPM::PredictVelOnFaces
                ((Box *)in_stack_ffffffffffffeca8.m_arena,in_stack_ffffffffffffeca0,
                 in_stack_ffffffffffffec98,in_stack_ffffffffffffec90,in_stack_ffffffffffffec88,
                 in_stack_ffffffffffffec80,in_stack_ffffffffffffed90,in_stack_ffffffffffffed98,
                 in_stack_ffffffffffffeda0,geom_00,in_stack_ffffffffffffec78,
                 (BCRec *)in_stack_ffffffffffffee70);
    }
    amrex::Box::Box<double>((Box *)pFVar9,(Array4<double> *)pGVar8);
    amrex::Box::Box<double>((Box *)pFVar9,(Array4<double> *)pGVar8);
    amrex::Box::Box<double>((Box *)pFVar9,(Array4<double> *)pGVar8);
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)&stack0xffffffffffffee60,&local_d90);
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)&stack0xffffffffffffee20,&local_e10);
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)&stack0xffffffffffffede0,(Array4<double> *)(local_ed0 + 0x40)
              );
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)&stack0xffffffffffffeda0,&local_dd0);
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)&stack0xffffffffffffed60,&local_e50);
    amrex::Array4<const_double>::Array4<const_double,_0>(&local_12e0,(Array4<double> *)local_ed0);
    ComputeAdvectiveVel(in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
                        in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
                        in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                        in_stack_ffffffffffffef40,in_stack_ffffffffffffef48,
                        in_stack_ffffffffffffef50,in_stack_ffffffffffffef58,
                        in_stack_ffffffffffffef60,in_stack_ffffffffffffef68,
                        in_stack_ffffffffffffef70,in_stack_ffffffffffffef78,
                        in_stack_ffffffffffffef80,in_stack_ffffffffffffee58,
                        in_stack_ffffffffffffef88,(bool)in_stack_ffffffffffffee57);
    in_stack_ffffffffffffe9b8 = (BARef *)local_c70.hash._M_h._M_buckets;
    in_stack_ffffffffffffe9c0 = local_c78;
    in_stack_ffffffffffffe9c8 = (FabArray<amrex::FArrayBox> *)local_d00._64_8_;
    in_stack_ffffffffffffe9d0 = &local_1320;
    amrex::Array4<const_double>::Array4<const_double,_0>(in_stack_ffffffffffffe9d0,&local_f10);
    in_stack_ffffffffffffe9d8 = (BaseFab<double> *)&stack0xffffffffffffeca0;
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)in_stack_ffffffffffffe9d8,&local_f70);
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)&stack0xffffffffffffec60,&local_fd0);
    in_stack_ffffffffffffea20 = local_a48;
    in_stack_ffffffffffffea28 = local_a50;
    in_stack_ffffffffffffea30 = in_stack_00000008;
    ExtrapVelToFacesOnBox
              (in_stack_00000d10,in_stack_00000d0c,in_stack_00000d00,in_stack_00000cf8,
               in_stack_00000cf0,in_stack_00000ce8,in_stack_00001ed0,in_stack_00001ed8,
               in_stack_00001ee0,in_stack_00001ee8,in_stack_00001ef0,in_stack_00001ef8,
               in_stack_00001f00,in_stack_00001f08,in_stack_00001f10,in_stack_00001f18,
               in_stack_00001f20,in_stack_00001f28,in_stack_00001f30,in_stack_00001f38,
               in_stack_00001f40,in_stack_00000ce0,in_stack_00001f48,(bool)in_stack_00000cdf,
               in_stack_00001f58);
    amrex::Gpu::streamSynchronize();
    amrex::MFIter::operator++(&local_b00);
  }
  amrex::MFIter::~MFIter(in_stack_ffffffffffffe9c0);
  amrex::FArrayBox::~FArrayBox((FArrayBox *)0x665d69);
  return;
}

Assistant:

void
Godunov::ExtrapVelToFaces ( MultiFab const& a_vel,
                            MultiFab const& a_forces,
                            MultiFab& a_umac,
                            MultiFab& a_vmac,
                            MultiFab& a_wmac,
                            const Vector<BCRec> & h_bcrec,
                const        BCRec  * d_bcrec,
                            const Geometry& geom, Real l_dt,
                            bool use_ppm, bool use_forces_in_trans)
{
    Box const& domain = geom.Domain();
    const Real* dx    = geom.CellSize();

    const int ncomp = AMREX_SPACEDIM;
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox scratch;
        for (MFIter mfi(a_vel,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            Box const& bxg1 = amrex::grow(bx,1);

            Box const& xbx = mfi.nodaltilebox(0);
            Box const& ybx = mfi.nodaltilebox(1);
            Box const& zbx = mfi.nodaltilebox(2);

            Array4<Real> const& umac = a_umac.array(mfi);
            Array4<Real> const& vmac = a_vmac.array(mfi);
            Array4<Real> const& wmac = a_wmac.array(mfi);

            Array4<Real const> const& vel = a_vel.const_array(mfi);
            Array4<Real const> const& f   = a_forces.const_array(mfi);

            scratch.resize(bxg1, (ncomp*4 + 1)*AMREX_SPACEDIM);
            Real* p = scratch.dataPtr();

            Array4<Real> Imx = makeArray4(p,bxg1,ncomp);
            p +=         Imx.size();
            Array4<Real> Ipx = makeArray4(p,bxg1,ncomp);
            p +=         Ipx.size();
            Array4<Real> Imy = makeArray4(p,bxg1,ncomp);
            p +=         Imy.size();
            Array4<Real> Ipy = makeArray4(p,bxg1,ncomp);
            p +=         Ipy.size();
            Array4<Real> Imz = makeArray4(p,bxg1,ncomp);
            p +=         Imz.size();
            Array4<Real> Ipz = makeArray4(p,bxg1,ncomp);
            p +=         Ipz.size();
            Array4<Real> u_ad = makeArray4(p,Box(bx).grow(1,1).grow(2,1).surroundingNodes(0),1);
            p +=         u_ad.size();
            Array4<Real> v_ad = makeArray4(p,Box(bx).grow(0,1).grow(2,1).surroundingNodes(1),1);
            p +=         v_ad.size();
            Array4<Real> w_ad = makeArray4(p,Box(bx).grow(0,1).grow(1,1).surroundingNodes(2),1);
            p +=         w_ad.size();

            if (use_ppm)
            {
                PPM::PredictVelOnFaces( bxg1,
                                        Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                        vel, vel,
                                        geom, l_dt, d_bcrec);
            }
            else
            {
                PLM::PredictVelOnXFace( Box(u_ad), AMREX_SPACEDIM, Imx, Ipx, vel, vel,
                                         geom, l_dt, h_bcrec, d_bcrec);
                PLM::PredictVelOnYFace( Box(v_ad), AMREX_SPACEDIM, Imy, Ipy, vel, vel,
                                        geom, l_dt, h_bcrec, d_bcrec);
                PLM::PredictVelOnZFace( Box(w_ad), AMREX_SPACEDIM, Imz, Ipz, vel, vel,
                                        geom, l_dt, h_bcrec, d_bcrec);
            }

            ComputeAdvectiveVel( Box(u_ad), Box(v_ad), Box(w_ad),
                                 u_ad, v_ad, w_ad,
                                 Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                 vel, f, domain, l_dt, d_bcrec, use_forces_in_trans);

            ExtrapVelToFacesOnBox( bx, ncomp,
                                   xbx, ybx, zbx,
                                   umac, vmac, wmac, vel,
                                   u_ad, v_ad, w_ad,
                                   Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                   f, domain, dx, l_dt, d_bcrec, use_forces_in_trans, p);

            Gpu::streamSynchronize();  // otherwise we might be using too much memory
        }
    }
}